

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::ArrayFeatureType
          (ArrayFeatureType *this,ArrayFeatureType *from)

{
  ShapeFlexibilityCase SVar1;
  DefaultOptionalValueCase DVar2;
  int32 value;
  InternalMetadataWithArenaLite *this_00;
  ArrayFeatureType_EnumeratedShapes *this_01;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *this_02;
  ArrayFeatureType_ShapeRange *from_01;
  float value_00;
  double value_01;
  ArrayFeatureType *from_local;
  ArrayFeatureType *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ArrayFeatureType_006248b0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->shape_,&from->shape_);
  ShapeFlexibilityUnion::ShapeFlexibilityUnion((ShapeFlexibilityUnion *)&this->ShapeFlexibility_);
  DefaultOptionalValueUnion::DefaultOptionalValueUnion
            ((DefaultOptionalValueUnion *)&this->defaultOptionalValue_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  this->datatype_ = from->datatype_;
  clear_has_ShapeFlexibility(this);
  SVar1 = ShapeFlexibility_case(from);
  if (SVar1 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar1 == kEnumeratedShapes) {
      this_01 = mutable_enumeratedshapes(this);
      from_00 = enumeratedshapes(from);
      ArrayFeatureType_EnumeratedShapes::MergeFrom(this_01,from_00);
    }
    else if (SVar1 == kShapeRange) {
      this_02 = mutable_shaperange(this);
      from_01 = shaperange(from);
      ArrayFeatureType_ShapeRange::MergeFrom(this_02,from_01);
    }
  }
  clear_has_defaultOptionalValue(this);
  DVar2 = defaultOptionalValue_case(from);
  if (DVar2 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar2 == kIntDefaultValue) {
      value = intdefaultvalue(from);
      set_intdefaultvalue(this,value);
    }
    else if (DVar2 == kFloatDefaultValue) {
      value_00 = floatdefaultvalue(from);
      set_floatdefaultvalue(this,value_00);
    }
    else if (DVar2 == kDoubleDefaultValue) {
      value_01 = doubledefaultvalue(from);
      set_doubledefaultvalue(this,value_01);
    }
  }
  return;
}

Assistant:

ArrayFeatureType::ArrayFeatureType(const ArrayFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shape_(from.shape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  datatype_ = from.datatype_;
  clear_has_ShapeFlexibility();
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from.enumeratedshapes());
      break;
    }
    case kShapeRange: {
      mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from.shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  clear_has_defaultOptionalValue();
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      set_intdefaultvalue(from.intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      set_floatdefaultvalue(from.floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      set_doubledefaultvalue(from.doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureType)
}